

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regenc.c
# Opt level: O2

int onigenc_with_ascii_strncmp(OnigEncoding enc,OnigUChar *p,OnigUChar *end,OnigUChar *sascii,int n)

{
  OnigCodePoint OVar1;
  int iVar2;
  
  while( true ) {
    if (n < 1) {
      return 0;
    }
    if (end <= p) break;
    OVar1 = (*enc->mbc_to_code)(p,end);
    if (*sascii - OVar1 != 0) {
      return *sascii - OVar1;
    }
    sascii = sascii + 1;
    iVar2 = (*enc->mbc_enc_len)(p);
    p = p + iVar2;
    n = n + -1;
  }
  return (uint)*sascii;
}

Assistant:

extern int
onigenc_with_ascii_strncmp(OnigEncoding enc, const UChar* p, const UChar* end,
                           const UChar* sascii /* ascii */, int n)
{
  int x, c;

  while (n-- > 0) {
    if (p >= end) return (int )(*sascii);

    c = (int )ONIGENC_MBC_TO_CODE(enc, p, end);
    x = *sascii - c;
    if (x) return x;

    sascii++;
    p += enclen(enc, p);
  }
  return 0;
}